

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O3

void __thiscall StandardOutput::~StandardOutput(StandardOutput *this)

{
  operator_delete(this);
  return;
}

Assistant:

StandardOutput()
	{
		istty = isatty(fileno(stdout)) != 0;

	#ifndef _WIN32
		const char* term = getenv("TERM");

		istty = istty && term && strcmp(term, "dumb") != 0;
	#endif

	#ifdef _WIN32
		if (istty)
			SetConsoleOutputCP(CP_UTF8);
	#endif
	}